

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O2

char * nullcDebugGetVmAddressLocation(uint instruction,uint full)

{
  byte *pbVar1;
  byte bVar2;
  uint moduleIndex;
  byte *sourceLocation;
  ExternFuncInfo *pEVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  byte *pbVar7;
  byte *pbVar8;
  long lVar9;
  uint i;
  uint uVar10;
  uint column;
  uint local_288;
  long local_280;
  uint local_274;
  OutputContext local_270;
  
  nullcDebugGetVmAddressLocation::buffer.pos = 0;
  local_270.outputBuf = local_270.outputBufDef;
  local_270.outputBufSize = 0x100;
  local_270.outputBufPos = 0;
  local_270.tempBuf = local_270.tempBufDef;
  local_270.tempBufSize = 0x100;
  local_270.openStream = OutputContext::FileOpen;
  local_270.closeStream = OutputContext::FileClose;
  local_270.stream = &nullcDebugGetVmAddressLocation::buffer;
  local_270.writeStream = anon_unknown.dwarf_4364::BufferWriteStream;
  if (NULLC::linker == 0) {
    pbVar7 = (byte *)0x0;
    pEVar3 = (ExternFuncInfo *)0x0;
    local_288 = 0;
    local_280 = 0;
    uVar10 = 0;
    lVar5 = 0;
  }
  else {
    local_288 = *(uint *)(NULLC::linker + 0x24c);
    pEVar3 = *(ExternFuncInfo **)(NULLC::linker + 0x240);
    local_280 = *(long *)(NULLC::linker + 0x290);
    pbVar7 = *(byte **)(NULLC::linker + 0x2a0);
    uVar10 = *(uint *)(NULLC::linker + 0x28c);
    lVar5 = *(long *)(NULLC::linker + 0x280);
  }
  sourceLocation = (byte *)nullcDebugGetInstructionSourceLocation(instruction);
  moduleIndex = nullcDebugGetSourceLocationModuleIndex((char *)sourceLocation);
  if (full != 0) {
    if (moduleIndex < uVar10) {
      OutputContext::Printf
                (&local_270,"{%s} ",
                 (ulong)*(uint *)(lVar5 + 4 + (ulong)moduleIndex * 0x1c) + local_280);
    }
    else {
      OutputContext::Printf(&local_270,"{root} ");
    }
  }
  pEVar3 = nullcDebugConvertAddressToFunction(instruction,pEVar3,local_288);
  if (pEVar3 == (ExternFuncInfo *)0x0) {
    OutputContext::Print(&local_270,"nullcGlobal()");
  }
  else {
    OutputContext::Printf(&local_270,"%s(",(ulong)pEVar3->offsetToName + local_280);
    if (NULLC::linker == 0) {
      lVar5 = 0;
      lVar9 = 0;
    }
    else {
      lVar5 = *(long *)(NULLC::linker + 0x200);
      lVar9 = *(long *)(NULLC::linker + 0x270);
    }
    for (uVar10 = 0; uVar10 < pEVar3->paramCount; uVar10 = uVar10 + 1) {
      lVar4 = (ulong)(pEVar3->offsetToFirstLocal + uVar10) * 0x1c;
      if (*(char *)(lVar9 + lVar4) == '\0') {
        lVar4 = lVar4 + lVar9;
        pcVar6 = ", ";
        if (uVar10 == 0) {
          pcVar6 = "";
        }
        OutputContext::Printf
                  (&local_270,"%s%s %s",pcVar6,
                   (ulong)*(uint *)(lVar5 + (ulong)*(uint *)(lVar4 + 4) * 0x50) + local_280,
                   (ulong)*(uint *)(lVar4 + 0x18) + local_280);
      }
    }
    OutputContext::Print(&local_270,")");
  }
  if (sourceLocation == (byte *)0x0) {
    if (local_270.outputBufPos != 0) {
      (*local_270.writeStream)(local_270.stream,local_270.outputBuf,local_270.outputBufPos);
    }
  }
  else {
    local_274 = 0;
    uVar10 = nullcDebugGetSourceLocationLineAndColumn((char *)sourceLocation,moduleIndex,&local_274)
    ;
    if (full == 0) {
      OutputContext::Printf(&local_270," Line %d",(ulong)(uVar10 + 1));
    }
    else {
      do {
        pbVar8 = pbVar7;
        if (sourceLocation == pbVar7) break;
        pbVar1 = sourceLocation + -1;
        pbVar8 = sourceLocation;
        sourceLocation = sourceLocation + -1;
      } while (*pbVar1 != 10);
      for (; (bVar2 = *pbVar8, bVar2 == 9 || (bVar2 == 0x20)); pbVar8 = pbVar8 + 1) {
      }
      lVar5 = 0;
      while ((0xd < bVar2 || ((0x2401U >> (bVar2 & 0x1f) & 1) == 0))) {
        bVar2 = pbVar8[lVar5 + 1];
        lVar5 = lVar5 + 1;
      }
      OutputContext::Printf(&local_270," Line %d at \'%.*s\'",(ulong)(uVar10 + 1),lVar5,pbVar8);
    }
    if (local_270.outputBufPos != 0) {
      (*local_270.writeStream)(local_270.stream,local_270.outputBuf,local_270.outputBufPos);
    }
  }
  local_270._264_8_ = local_270._264_8_ & 0xffffffff;
  local_270.stream = (void *)0x0;
  nullcDebugGetVmAddressLocation::buffer.buf[nullcDebugGetVmAddressLocation::buffer.pos] = '\0';
  OutputContext::~OutputContext(&local_270);
  return nullcDebugGetVmAddressLocation::buffer.buf;
}

Assistant:

const char* nullcDebugGetVmAddressLocation(unsigned instruction, unsigned full)
{
	using namespace NULLC;

	static OutputBuffer buffer;

	// Reset position
	buffer.pos = 0;

	OutputContext output;

	output.stream = &buffer;
	output.writeStream = BufferWriteStream;

	unsigned functionCount = 0;
	ExternFuncInfo *functions = nullcDebugFunctionInfo(&functionCount);

	char *symbols = nullcDebugSymbols(NULL);

	char *fullSource = nullcDebugSource();

	unsigned moduleCount = 0;
	ExternModuleInfo *modules = nullcDebugModuleInfo(&moduleCount);

	const char *sourceLocation = nullcDebugGetInstructionSourceLocation(instruction);

	unsigned moduleIndex = nullcDebugGetSourceLocationModuleIndex(sourceLocation);

	if(full)
	{
		if(moduleIndex < moduleCount)
			output.Printf("{%s} ", symbols + modules[moduleIndex].nameOffset);
		else
			output.Printf("{root} ");
	}

	ExternFuncInfo *targetFunction = nullcDebugConvertAddressToFunction(instruction, functions, functionCount);

	if(targetFunction)
	{
		output.Printf("%s(", symbols + targetFunction->offsetToName);

		unsigned exTypesSize = 0;
		ExternTypeInfo *exTypes = nullcDebugTypeInfo(&exTypesSize);

		unsigned exLocalsSize = 0;
		ExternLocalInfo *exLocals = nullcDebugLocalInfo(&exLocalsSize);

		for(unsigned i = 0; i < targetFunction->paramCount; i++)
		{
			ExternLocalInfo &lInfo = exLocals[targetFunction->offsetToFirstLocal + i];

			if(lInfo.paramType != ExternLocalInfo::PARAMETER)
				continue;

			output.Printf("%s%s %s", i != 0 ? ", " : "", symbols + exTypes[lInfo.type].offsetToName, symbols + lInfo.offsetToName);
		}

		output.Print(")");
	}
	else
	{
		output.Print("nullcGlobal()");
	}

	// Stop if source location is missing
	if(!sourceLocation)
	{
		output.Flush();
		output.stream = NULL;
		buffer.buf[buffer.pos] = 0;

		return buffer.buf;
	}

	const char *codeStart = sourceLocation;

	unsigned column = 0;
	unsigned line = nullcDebugGetSourceLocationLineAndColumn(codeStart, moduleIndex, column);

	if(full)
	{
		// Find beginning of the line
		while(codeStart != fullSource && *(codeStart - 1) != '\n')
			codeStart--;

		// Skip whitespace
		while(*codeStart == ' ' || *codeStart == '\t')
			codeStart++;

		const char *codeEnd = codeStart;

		// Find ending of the line
		while(*codeEnd != '\0' && *codeEnd != '\r' && *codeEnd != '\n')
			codeEnd++;

		int codeLength = int(codeEnd - codeStart);
		output.Printf(" Line %d at '%.*s'", line + 1, codeLength, codeStart);
	}
	else
	{
		output.Printf(" Line %d", line + 1);
	}

	output.Flush();
	output.stream = NULL;
	buffer.buf[buffer.pos] = 0;

	return buffer.buf;
}